

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data.hpp
# Opt level: O0

void * __thiscall henson::Array::void_ptr(Array *this)

{
  void *pvVar1;
  variant<void_*,_float_*,_double_*,_int_*,_long_*> *in_stack_00000008;
  
  pvVar1 = mpark::
           visit<henson::Array::get_void_ptr,mpark::variant<void*,float*,double*,int*,long*>const&>
                     ((get_void_ptr *)this,in_stack_00000008);
  return pvVar1;
}

Assistant:

void*   void_ptr() const                    { return visit(get_void_ptr {}, address); }